

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O3

void si9ma::Trie::insert(TrieNode *root,string *str)

{
  size_type sVar1;
  int iVar2;
  TrieNode *pTVar3;
  long lVar4;
  size_type sVar5;
  
  root->pass = root->pass + 1;
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    sVar5 = 0;
    do {
      lVar4 = (long)(str->_M_dataplus)._M_p[sVar5];
      pTVar3 = *(TrieNode **)((long)root + lVar4 * 8 + -0x300);
      if (pTVar3 == (TrieNode *)0x0) {
        pTVar3 = (TrieNode *)operator_new(0xd8);
        memset(pTVar3,0,0xd8);
        *(TrieNode **)((long)root + lVar4 * 8 + -0x300) = pTVar3;
        iVar2 = 1;
        root = pTVar3;
      }
      else {
        iVar2 = pTVar3->pass + 1;
        root = pTVar3;
      }
      root->pass = iVar2;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  root->end = root->end + 1;
  return;
}

Assistant:

void Trie::insert(TrieNode *root,const string &str) {
        root->pass ++;
        auto *cur = root;

        for (int i = 0; i < str.length(); ++i) {
            int index = str[i] - 'a';

            if (cur->nexts[index] == nullptr){
                cur->nexts[index] = new TrieNode(0,0);
            }
            cur->nexts[index]->pass++;
            cur = cur->nexts[index];
        }

        cur->end ++;
    }